

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O0

int Gia_NodeMffcSize(Gia_Man_t *p,Gia_Obj_t *pNode)

{
  int iVar1;
  int iVar2;
  int ConeSize2;
  int ConeSize1;
  Gia_Obj_t *pNode_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_IsComplement(pNode);
  if (iVar1 != 0) {
    __assert_fail("!Gia_IsComplement(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaUtil.c"
                  ,0x481,"int Gia_NodeMffcSize(Gia_Man_t *, Gia_Obj_t *)");
  }
  iVar1 = Gia_ObjIsCand(pNode);
  if (iVar1 == 0) {
    __assert_fail("Gia_ObjIsCand(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaUtil.c"
                  ,0x482,"int Gia_NodeMffcSize(Gia_Man_t *, Gia_Obj_t *)");
  }
  iVar1 = Gia_NodeDeref_rec(p,pNode);
  iVar2 = Gia_NodeRef_rec(p,pNode,0);
  if (iVar1 != iVar2) {
    __assert_fail("ConeSize1 == ConeSize2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaUtil.c"
                  ,0x485,"int Gia_NodeMffcSize(Gia_Man_t *, Gia_Obj_t *)");
  }
  if (-1 < iVar1) {
    return iVar1;
  }
  __assert_fail("ConeSize1 >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaUtil.c"
                ,0x486,"int Gia_NodeMffcSize(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

int Gia_NodeMffcSize( Gia_Man_t * p, Gia_Obj_t * pNode )
{
    int ConeSize1, ConeSize2;
    assert( !Gia_IsComplement(pNode) );
    assert( Gia_ObjIsCand(pNode) );
    ConeSize1 = Gia_NodeDeref_rec( p, pNode );
    ConeSize2 = Gia_NodeRef_rec( p, pNode, 0 );
    assert( ConeSize1 == ConeSize2 );
    assert( ConeSize1 >= 0 );
    return ConeSize1;
}